

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file.cpp
# Opt level: O2

size_t __thiscall
pstore::file::in_memory::read_buffer(in_memory *this,not_null<void_*> ptr,size_t nbytes)

{
  ulong offset;
  size_t sVar1;
  size_t count;
  span<unsigned_char,__1L> span;
  span_iterator<pstore::gsl::span<unsigned_char,__1L>,_false> local_70;
  span_iterator<pstore::gsl::span<unsigned_char,__1L>,_false> local_60;
  storage_type<pstore::gsl::details::extent_type<_1L>_> local_50;
  storage_type<pstore::gsl::details::extent_type<_1L>_> local_40;
  
  offset = this->pos_;
  sVar1 = this->eof_ - offset;
  count = nbytes;
  if (CARRY8(offset,nbytes)) {
    count = sVar1;
  }
  if (this->eof_ < offset + nbytes) {
    count = sVar1;
  }
  if (((-1 < (long)this->length_) && (-1 < (long)offset)) && (-1 < (long)count)) {
    local_50 = (storage_type<pstore::gsl::details::extent_type<_1L>_>)
               gsl::make_span<unsigned_char>
                         ((this->buffer_).
                          super___shared_ptr<unsigned_char,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                          this->length_);
    local_40 = (storage_type<pstore::gsl::details::extent_type<_1L>_>)
               gsl::span<unsigned_char,_-1L>::subspan
                         ((span<unsigned_char,__1L> *)&local_50,offset,count);
    gsl::span<unsigned_char,_-1L>::begin((span<unsigned_char,__1L> *)&local_60);
    gsl::span<unsigned_char,_-1L>::end((span<unsigned_char,__1L> *)&local_70);
    std::
    copy<pstore::gsl::details::span_iterator<pstore::gsl::span<unsigned_char,_1l>,false>,unsigned_char*>
              (&local_60,&local_70,(uchar *)ptr.ptr_);
    if (!CARRY8(this->pos_,count)) {
      this->pos_ = this->pos_ + count;
      return count;
    }
    assert_failed("pos_ + nbytes >= pos_",
                  "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/lib/os/file.cpp"
                  ,0xcb);
  }
  assert_failed("length_ <= max && pos_ <= max && nbytes <= max",
                "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/lib/os/file.cpp"
                ,0xc1);
}

Assistant:

std::size_t in_memory::read_buffer (gsl::not_null<void *> const ptr, std::size_t nbytes) {
            // The second half of this check is to catch integer overflows.
            if (pos_ + nbytes > eof_ || pos_ + nbytes < pos_) {
                nbytes = eof_ - pos_;
            }

            using element_type = decltype (buffer_)::element_type;
            using index_type = gsl::span<decltype (buffer_)::element_type>::index_type;

#ifndef NDEBUG
            {
                constexpr auto max = std::numeric_limits<index_type>::max ();
                PSTORE_ASSERT (length_ <= max && pos_ <= max && nbytes <= max);
            }
#endif
            auto const length = static_cast<index_type> (length_);
            auto const pos = static_cast<index_type> (pos_);
            auto span = gsl::make_span (buffer_.get (), length)
                            .subspan (pos, static_cast<index_type> (nbytes));
            std::copy (std::begin (span), std::end (span),
                       static_cast<element_type *> (ptr.get ()));

            PSTORE_ASSERT (pos_ + nbytes >= pos_);
            pos_ += nbytes;
            return nbytes;
        }